

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

Value * __thiscall
BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr,
          Sym *dstSym,Sym *srcSym)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  Value **ppVVar4;
  undefined4 *puVar5;
  Value *pVVar6;
  Value **local_38;
  
  if (dstSym == (Sym *)0x0) {
    local_38 = (Value **)0x0;
  }
  else {
    local_38 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,dstSym);
  }
  ppVVar4 = ValueHashTable<Sym_*,_Value_*>::Get(localSymToValueMap,srcSym->m_id);
  if (ppVVar4 == (Value **)0x0) {
    pVVar6 = GlobOptBlockData::FindValue(&this->globOptData,srcSym);
    if ((pVVar6 != (Value *)0x0) && (globOpt->prePassLoop != (Loop *)0x0)) {
      if (srcSym->m_kind == SymKindStack) {
        bVar3 = GlobOpt::IsSafeToTransferInPrepass(globOpt,(StackSym *)srcSym,pVVar6->valueInfo);
        if (bVar3) goto LAB_00421bb8;
      }
      pVVar6 = (Value *)0x0;
    }
  }
  else {
    pVVar6 = *ppVVar4;
  }
LAB_00421bb8:
  if (dstSym != (Sym *)0x0) {
    OVar1 = instr->m_opcode;
    if (((1 < OVar1 - 0x1e4) && (OVar1 != Ld_A)) && (OVar1 != LdFld)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1197,"(IsCopyTypeInstr(instr))","IsCopyTypeInstr(instr)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    *local_38 = pVVar6;
  }
  return pVVar6;
}

Assistant:

Value * BasicBlock::FindValueInLocalThenGlobalValueTableAndUpdate(GlobOpt *globOpt, GlobHashTable * localSymToValueMap, IR::Instr *instr, Sym *dstSym, Sym *srcSym)
{
    Value ** localDstValue = nullptr;
    Value * srcVal = nullptr;
    if (dstSym)
    {
        localDstValue = localSymToValueMap->FindOrInsertNew(dstSym);
    }
    Value ** localSrcValue = localSymToValueMap->Get(srcSym);
    if (!localSrcValue)
    {
        Value *globalValue = this->globOptData.FindValue(srcSym);
        if (globOpt->IsLoopPrePass() && globalValue && (!srcSym->IsStackSym() || !globOpt->IsSafeToTransferInPrepass(srcSym->AsStackSym(), globalValue->GetValueInfo())))
        {
            srcVal = nullptr;
        }
        else
        {
            srcVal = globalValue;
        }
    }
    else
    {
        srcVal = *localSrcValue;
    }
    if (dstSym)
    {
        Assert(IsCopyTypeInstr(instr));
        *localDstValue = srcVal;
    }

    return srcVal;
}